

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

ostream * ClipperLib::operator<<(ostream *s,Path *p)

{
  pointer pIVar1;
  pointer pIVar2;
  ostream *poVar3;
  long lVar4;
  
  pIVar1 = (p->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (p->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pIVar1 != pIVar2) {
    lVar4 = (long)pIVar2 - (long)pIVar1 >> 4;
    while (lVar4 = lVar4 + -1, lVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(s,"(",1);
      poVar3 = std::ostream::_M_insert<long_long>((longlong)s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"), ",3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(s,"(",1);
    poVar3 = std::ostream::_M_insert<long_long>((longlong)s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
  }
  return s;
}

Assistant:

std::ostream& operator <<(std::ostream &s, const Path &p)
{
  if (p.empty()) return s;
  Path::size_type last = p.size() -1;
  for (Path::size_type i = 0; i < last; i++)
    s << "(" << p[i].X << "," << p[i].Y << "), ";
  s << "(" << p[last].X << "," << p[last].Y << ")\n";
  return s;
}